

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void handle_filter_opt(char *_arg,int en)

{
  int iVar1;
  char *__s1;
  char *token;
  char *tokens;
  char *arg;
  char *pcStack_10;
  int en_local;
  char *_arg_local;
  
  arg._4_4_ = en;
  pcStack_10 = _arg;
  token = strdup(_arg);
  tokens = token;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  while( true ) {
                                    while( true ) {
                                      while( true ) {
                                        while( true ) {
                                          while( true ) {
                                            while( true ) {
                                              while( true ) {
                                                while( true ) {
                                                  while( true ) {
                                                    while( true ) {
                                                      while( true ) {
                                                        while( true ) {
                                                          while( true ) {
                                                            while( true ) {
                                                              while( true ) {
                                                                while( true ) {
                                                                  while( true ) {
                                                                    while( true ) {
                                                                      while( true ) {
                                                                        while( true ) {
                                                                          while( true ) {
                                                                            while( true ) {
                                                                              while( true ) {
                                                                                while( true ) {
                                                                                  if (token == (char
                                                                                                *)
                                                  0x0) {
                                                    free(tokens);
                                                    return;
                                                  }
                                                  __s1 = strsep(&token,",");
                                                  iVar1 = strcmp(__s1,"write");
                                                  if (iVar1 != 0) break;
                                                  _filter_write(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"read");
                                                  if (iVar1 != 0) break;
                                                  _filter_read(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"gpu-addr");
                                                  if (iVar1 != 0) break;
                                                  _filter_gpu_addr(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"mem");
                                                  if (iVar1 != 0) break;
                                                  _filter_write(arg._4_4_);
                                                  _filter_read(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"ioctl-raw");
                                                  if (iVar1 != 0) break;
                                                  _filter_ioctl_raw(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"ioctl-desc");
                                                  if (iVar1 != 0) break;
                                                  _filter_ioctl_desc(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"ioctl");
                                                  if (iVar1 != 0) break;
                                                  if (arg._4_4_ == 0) {
                                                    _filter_ioctl_raw(0);
                                                  }
                                                  _filter_ioctl_desc(arg._4_4_);
                                                  _filter_dump_object_tree_on_create_destroy
                                                            (arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"tsc");
                                                  if (iVar1 != 0) break;
                                                  _filter_tsc(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"tic");
                                                  if (iVar1 != 0) break;
                                                  _filter_tic(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"vp");
                                                  if (iVar1 != 0) break;
                                                  _filter_vp(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"fp");
                                                  if (iVar1 != 0) break;
                                                  _filter_fp(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"gp");
                                                  if (iVar1 != 0) break;
                                                  _filter_gp(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"cp");
                                                  if (iVar1 != 0) break;
                                                  _filter_cp(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"tep");
                                                  if (iVar1 != 0) break;
                                                  _filter_tep(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"tcp");
                                                  if (iVar1 != 0) break;
                                                  _filter_tcp(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"shader");
                                                  if (iVar1 != 0) break;
                                                  _filter_vp(arg._4_4_);
                                                  _filter_fp(arg._4_4_);
                                                  _filter_gp(arg._4_4_);
                                                  _filter_tcp(arg._4_4_);
                                                  _filter_tep(arg._4_4_);
                                                  }
                                                  iVar1 = strcmp(__s1,"macro-rt-verbose");
                                                  if (iVar1 != 0) break;
                                                  _filter_macro_rt_verbose(arg._4_4_);
                                                }
                                                iVar1 = strcmp(__s1,"macro-rt");
                                                if (iVar1 != 0) break;
                                                _filter_macro_rt(arg._4_4_);
                                              }
                                              iVar1 = strcmp(__s1,"macro-dis");
                                              if (iVar1 != 0) break;
                                              _filter_macro_dis_enabled(arg._4_4_);
                                            }
                                            iVar1 = strcmp(__s1,"macro");
                                            if (iVar1 != 0) break;
                                            if (arg._4_4_ == 0) {
                                              _filter_macro_rt_verbose(0);
                                            }
                                            _filter_macro_rt(arg._4_4_);
                                            _filter_macro_dis_enabled(arg._4_4_);
                                          }
                                          iVar1 = strcmp(__s1,"buffer-usage");
                                          if (iVar1 != 0) break;
                                          _filter_buffer_usage(arg._4_4_);
                                        }
                                        iVar1 = strncmp(__s1,"class=",6);
                                        if (iVar1 != 0) break;
                                        iVar1 = strcmp(__s1 + 6,"all");
                                        if (iVar1 == 0) {
                                          _filter_all_classes(arg._4_4_);
                                        }
                                        else {
                                          _filter_class(__s1 + 6,arg._4_4_);
                                        }
                                      }
                                      iVar1 = strcmp(__s1,"pb");
                                      if (iVar1 != 0) break;
                                      _filter_decode_pb(arg._4_4_);
                                    }
                                    iVar1 = strcmp(__s1,"sys_mmap");
                                    if (iVar1 != 0) break;
                                    _filter_sys_mmap(arg._4_4_);
                                  }
                                  iVar1 = strcmp(__s1,"sys_mmap_details");
                                  if (iVar1 != 0) break;
                                  _filter_sys_mmap_details(arg._4_4_);
                                }
                                iVar1 = strcmp(__s1,"sys_munmap");
                                if (iVar1 != 0) break;
                                _filter_sys_munmap(arg._4_4_);
                              }
                              iVar1 = strcmp(__s1,"sys_mremap");
                              if (iVar1 != 0) break;
                              _filter_sys_mremap(arg._4_4_);
                            }
                            iVar1 = strcmp(__s1,"sys_open");
                            if (iVar1 != 0) break;
                            _filter_sys_open(arg._4_4_);
                          }
                          iVar1 = strcmp(__s1,"msg");
                          if (iVar1 != 0) break;
                          _filter_msg(arg._4_4_);
                        }
                        iVar1 = strcmp(__s1,"sys_write");
                        if (iVar1 != 0) break;
                        _filter_sys_write(arg._4_4_);
                      }
                      iVar1 = strcmp(__s1,"sys");
                      if (iVar1 != 0) break;
                      _filter_sys_mmap(arg._4_4_);
                      if (arg._4_4_ == 0) {
                        _filter_sys_mmap_details(0);
                      }
                      _filter_sys_munmap(arg._4_4_);
                      _filter_sys_mremap(arg._4_4_);
                      _filter_sys_open(arg._4_4_);
                      _filter_sys_write(arg._4_4_);
                      if (arg._4_4_ == 0) {
                        _filter_ioctl_raw(0);
                      }
                      _filter_ioctl_desc(arg._4_4_);
                      _filter_dump_object_tree_on_create_destroy(arg._4_4_);
                    }
                    iVar1 = strcmp(__s1,"nvrm-handle-desc");
                    if (iVar1 != 0) break;
                    _filter_nvrm_describe_handles(arg._4_4_);
                  }
                  iVar1 = strcmp(__s1,"nvrm-class-desc");
                  if (iVar1 != 0) break;
                  _filter_nvrm_describe_classes(arg._4_4_);
                }
                iVar1 = strncmp(__s1,"nvrm-mthd=",10);
                if (iVar1 != 0) break;
                iVar1 = strcmp(__s1 + 10,"all");
                if (iVar1 == 0) {
                  _filter_all_nvrm_mthds(arg._4_4_);
                }
                else {
                  _filter_nvrm_mthd(__s1 + 10,arg._4_4_);
                }
                if (arg._4_4_ != 0) {
                  _filter_nvrm_ioctl("call",arg._4_4_);
                  _filter_ioctl_desc(arg._4_4_);
                }
              }
              iVar1 = strcmp(__s1,"nvrm-unk-0-fields");
              if (iVar1 != 0) break;
              _filter_nvrm_show_unk_zero_fields(arg._4_4_);
            }
            iVar1 = strncmp(__s1,"nvrm-ioctl=",0xb);
            if (iVar1 != 0) break;
            iVar1 = strcmp(__s1 + 0xb,"all");
            if (iVar1 == 0) {
              _filter_all_nvrm_ioctls(arg._4_4_);
            }
            else {
              _filter_nvrm_ioctl(__s1 + 0xb,arg._4_4_);
            }
            if (arg._4_4_ != 0) {
              _filter_ioctl_desc(arg._4_4_);
            }
          }
          iVar1 = strcmp(__s1,"nvrm-obj-tree");
          if (iVar1 != 0) break;
          _filter_dump_object_tree_on_create_destroy(arg._4_4_);
        }
        iVar1 = strcmp(__s1,"nvrm");
        if (iVar1 != 0) break;
        if (arg._4_4_ != 0) {
          _filter_ioctl_desc(arg._4_4_);
        }
        _filter_all_nvrm_ioctls(arg._4_4_);
        _filter_all_nvrm_mthds(arg._4_4_);
        _filter_nvrm_describe_handles(arg._4_4_);
        _filter_nvrm_describe_classes(arg._4_4_);
        _filter_dump_object_tree_on_create_destroy(arg._4_4_);
      }
      iVar1 = strcmp(__s1,"info");
      if (iVar1 != 0) break;
      _filter_info(arg._4_4_);
    }
    iVar1 = strcmp(__s1,"all");
    if (iVar1 != 0) break;
    _filter_info(arg._4_4_);
    _filter_write(arg._4_4_);
    _filter_read(arg._4_4_);
    _filter_gpu_addr(arg._4_4_);
    _filter_ioctl_raw(arg._4_4_);
    _filter_ioctl_desc(arg._4_4_);
    _filter_tsc(arg._4_4_);
    _filter_tic(arg._4_4_);
    _filter_vp(arg._4_4_);
    _filter_fp(arg._4_4_);
    _filter_gp(arg._4_4_);
    _filter_cp(arg._4_4_);
    _filter_tep(arg._4_4_);
    _filter_tcp(arg._4_4_);
    _filter_macro_rt_verbose(arg._4_4_);
    _filter_macro_rt(arg._4_4_);
    _filter_macro_dis_enabled(arg._4_4_);
    _filter_buffer_usage(arg._4_4_);
    _filter_all_classes(arg._4_4_);
    _filter_decode_pb(arg._4_4_);
    _filter_sys_mmap(arg._4_4_);
    _filter_sys_mmap_details(arg._4_4_);
    _filter_sys_munmap(arg._4_4_);
    _filter_sys_mremap(arg._4_4_);
    _filter_sys_open(arg._4_4_);
    _filter_msg(arg._4_4_);
    _filter_sys_write(arg._4_4_);
    _filter_nvrm_describe_handles(arg._4_4_);
    _filter_nvrm_describe_classes(arg._4_4_);
    _filter_all_nvrm_mthds(arg._4_4_);
    _filter_nvrm_show_unk_zero_fields(arg._4_4_);
    _filter_all_nvrm_ioctls(arg._4_4_);
    _filter_dump_object_tree_on_create_destroy(arg._4_4_);
  }
  fprintf(_stderr,"unknown token: %s\n",__s1);
  fflush(_stderr);
  exit(1);
}

Assistant:

static void handle_filter_opt(const char *_arg, int en)
{
	char *arg = strdup(_arg);
	char *tokens = arg;

	while (tokens)
	{
		char *token = strsep(&tokens, ",");
		if (strcmp(token, "write") == 0)
			_filter_write(en);
		else if (strcmp(token, "read") == 0)
			_filter_read(en);
		else if (strcmp(token, "gpu-addr") == 0)
			_filter_gpu_addr(en);
		else if (strcmp(token, "mem") == 0)
		{
			_filter_write(en);
			_filter_read(en);
		}
		else if (strcmp(token, "ioctl-raw") == 0)
			_filter_ioctl_raw(en);
		else if (strcmp(token, "ioctl-desc") == 0)
			_filter_ioctl_desc(en);
		else if (strcmp(token, "ioctl") == 0)
		{
			if (!en)
				_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "tsc") == 0)
			_filter_tsc(en);
		else if (strcmp(token, "tic") == 0)
			_filter_tic(en);
		else if (strcmp(token, "vp") == 0)
			_filter_vp(en);
		else if (strcmp(token, "fp") == 0)
			_filter_fp(en);
		else if (strcmp(token, "gp") == 0)
			_filter_gp(en);
		else if (strcmp(token, "cp") == 0)
			_filter_cp(en);
		else if (strcmp(token, "tep") == 0)
			_filter_tep(en);
		else if (strcmp(token, "tcp") == 0)
			_filter_tcp(en);
		else if (strcmp(token, "shader") == 0)
		{
			_filter_vp(en);
			_filter_fp(en);
			_filter_gp(en);
			_filter_tcp(en);
			_filter_tep(en);
		}
		else if (strcmp(token, "macro-rt-verbose") == 0)
			_filter_macro_rt_verbose(en);
		else if (strcmp(token, "macro-rt") == 0)
			_filter_macro_rt(en);
		else if (strcmp(token, "macro-dis") == 0)
			_filter_macro_dis_enabled(en);
		else if (strcmp(token, "macro") == 0)
		{
			if (!en)
				_filter_macro_rt_verbose(en);
			_filter_macro_rt(en);
			_filter_macro_dis_enabled(en);
		}
		else if (strcmp(token, "buffer-usage") == 0)
			_filter_buffer_usage(en);
		else if (strncmp(token, "class=", 6) == 0)
		{
			if (strcmp(token + 6, "all") == 0)
				_filter_all_classes(en);
			else
				_filter_class(token + 6, en);
		}
		else if (strcmp(token, "pb") == 0)
			_filter_decode_pb(en);
		else if (strcmp(token, "sys_mmap") == 0)
			_filter_sys_mmap(en);
		else if (strcmp(token, "sys_mmap_details") == 0)
			_filter_sys_mmap_details(en);
		else if (strcmp(token, "sys_munmap") == 0)
			_filter_sys_munmap(en);
		else if (strcmp(token, "sys_mremap") == 0)
			_filter_sys_mremap(en);
		else if (strcmp(token, "sys_open") == 0)
			_filter_sys_open(en);
		else if (strcmp(token, "msg") == 0)
			_filter_msg(en);
		else if (strcmp(token, "sys_write") == 0)
			_filter_sys_write(en);
		else if (strcmp(token, "sys") == 0)
		{
			_filter_sys_mmap(en);
			if (!en)
				_filter_sys_mmap_details(en);
			_filter_sys_munmap(en);
			_filter_sys_mremap(en);
			_filter_sys_open(en);
			_filter_sys_write(en);

			if (!en)
				_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "nvrm-handle-desc") == 0)
			_filter_nvrm_describe_handles(en);
		else if (strcmp(token, "nvrm-class-desc") == 0)
			_filter_nvrm_describe_classes(en);
		else if (strncmp(token, "nvrm-mthd=", 10) == 0)
		{
			if (strcmp(token + 10, "all") == 0)
				_filter_all_nvrm_mthds(en);
			else
				_filter_nvrm_mthd(token + 10, en);
			if (en)
			{
				_filter_nvrm_ioctl("call", en);
				_filter_ioctl_desc(en);
			}
		}
		else if (strcmp(token, "nvrm-unk-0-fields") == 0)
			_filter_nvrm_show_unk_zero_fields(en);
		else if (strncmp(token, "nvrm-ioctl=", 11) == 0)
		{
			if (strcmp(token + 11, "all") == 0)
				_filter_all_nvrm_ioctls(en);
			else
				_filter_nvrm_ioctl(token + 11, en);
			if (en)
				_filter_ioctl_desc(en);
		}
		else if (strcmp(token, "nvrm-obj-tree") == 0)
			_filter_dump_object_tree_on_create_destroy(en);
		else if (strcmp(token, "nvrm") == 0)
		{
			if (en)
				_filter_ioctl_desc(en);
			_filter_all_nvrm_ioctls(en);
			_filter_all_nvrm_mthds(en);
			_filter_nvrm_describe_handles(en);
			_filter_nvrm_describe_classes(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "info") == 0)
			_filter_info(en);
		else if (strcmp(token, "all") == 0)
		{
			_filter_info(en);
			_filter_write(en);
			_filter_read(en);
			_filter_gpu_addr(en);
			_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_tsc(en);
			_filter_tic(en);
			_filter_vp(en);
			_filter_fp(en);
			_filter_gp(en);
			_filter_cp(en);
			_filter_tep(en);
			_filter_tcp(en);
			_filter_macro_rt_verbose(en);
			_filter_macro_rt(en);
			_filter_macro_dis_enabled(en);
			_filter_buffer_usage(en);
			_filter_all_classes(en);
			_filter_decode_pb(en);
			_filter_sys_mmap(en);
			_filter_sys_mmap_details(en);
			_filter_sys_munmap(en);
			_filter_sys_mremap(en);
			_filter_sys_open(en);
			_filter_msg(en);
			_filter_sys_write(en);
			_filter_nvrm_describe_handles(en);
			_filter_nvrm_describe_classes(en);
			_filter_all_nvrm_mthds(en);
			_filter_nvrm_show_unk_zero_fields(en);
			_filter_all_nvrm_ioctls(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else
		{
			fprintf(stderr, "unknown token: %s\n", token);
			fflush(stderr);
			exit(1);
		}
	}

	free(arg);
}